

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O2

int __thiscall
basisu::palette_index_reorderer::init(palette_index_reorderer *this,EVP_PKEY_CTX *ctx)

{
  uint_vec *this_00;
  void *pCtx;
  int extraout_EAX;
  uint32_t uVar1;
  int iVar2;
  uint *puVar3;
  uint in_ECX;
  uint32_t *in_RDX;
  ulong uVar4;
  uint num_indices;
  pEntry_dist_func in_R8;
  void *in_R9;
  uint32_t i;
  uint *i_00;
  uint32_t i_1;
  size_t i_01;
  float in_XMM0_Da;
  float fVar5;
  uint32_t entry_to_move;
  uint32_t best_entry;
  double best_count;
  uint32_t local_70;
  float local_6c;
  vector<unsigned_int> *local_68;
  uint local_5c;
  pEntry_dist_func local_58;
  void *local_50;
  vector<unsigned_int> *local_48;
  ulong local_40;
  double local_38;
  
  num_indices = (uint)ctx;
  if ((num_indices == 0) || (uVar4 = (ulong)in_ECX, in_ECX == 0)) {
    __assert_fail("(num_syms > 0) && (num_indices > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                  ,0x4e9,
                  "void basisu::palette_index_reorderer::init(uint32_t, const uint32_t *, uint32_t, pEntry_dist_func, void *, float)"
                 );
  }
  if ((0.0 <= in_XMM0_Da) && (in_XMM0_Da <= 1.0)) {
    local_6c = in_XMM0_Da;
    local_58 = in_R8;
    local_50 = in_R9;
    clear(this);
    local_48 = &this->m_remap_table;
    vector<unsigned_int>::resize(local_48,uVar4,false);
    local_68 = &this->m_entries_picked;
    vector<unsigned_int>::reserve(local_68,uVar4);
    local_40 = uVar4;
    vector<unsigned_int>::resize(&this->m_total_count_to_picked,uVar4,false);
    iVar2 = extraout_EAX;
    if (1 < num_indices) {
      prepare_hist(this,in_ECX,num_indices,in_RDX);
      find_initial(this,in_ECX);
      this_00 = &this->m_entries_to_do;
      puVar3 = (uint *)(ulong)(this->m_entries_to_do).m_size;
      while (pCtx = local_50, (int)puVar3 != 0) {
        find_next_entry(this,&local_5c,&local_38,local_58,local_50,local_6c);
        uVar4 = (ulong)local_5c;
        puVar3 = vector<unsigned_int>::operator[](this_00,uVar4);
        local_70 = *puVar3;
        fVar5 = pick_side(this,in_ECX,local_70,local_58,pCtx,local_6c);
        if (fVar5 <= 0.0) {
          vector<unsigned_int>::push_back(local_68,&local_70);
        }
        else {
          vector<unsigned_int>::insert(local_68,local_68->m_p,&local_70);
        }
        vector<unsigned_int>::erase(this_00,this_00->m_p + uVar4);
        for (i_00 = (uint *)0x0; puVar3 = (uint *)(ulong)(this->m_entries_to_do).m_size,
            i_00 < puVar3; i_00 = (uint *)((long)i_00 + 1)) {
          puVar3 = vector<unsigned_int>::operator[](this_00,(size_t)i_00);
          uVar1 = get_hist(this,*puVar3,local_70,in_ECX);
          puVar3 = vector<unsigned_int>::operator[](this_00,(size_t)i_00);
          puVar3 = vector<unsigned_int>::operator[](&this->m_total_count_to_picked,(ulong)*puVar3);
          *puVar3 = *puVar3 + uVar1;
        }
      }
      for (i_01 = 0; iVar2 = (int)puVar3, local_40 != i_01; i_01 = i_01 + 1) {
        puVar3 = vector<unsigned_int>::operator[](local_68,i_01);
        puVar3 = vector<unsigned_int>::operator[](local_48,(ulong)*puVar3);
        *puVar3 = (uint)i_01;
      }
    }
    return iVar2;
  }
  __assert_fail("(dist_func_weight >= 0.0f) && (dist_func_weight <= 1.0f)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                ,0x4ea,
                "void basisu::palette_index_reorderer::init(uint32_t, const uint32_t *, uint32_t, pEntry_dist_func, void *, float)"
               );
}

Assistant:

void palette_index_reorderer::init(uint32_t num_indices, const uint32_t *pIndices, uint32_t num_syms, pEntry_dist_func pDist_func, void *pCtx, float dist_func_weight)
	{
		assert((num_syms > 0) && (num_indices > 0));
		assert((dist_func_weight >= 0.0f) && (dist_func_weight <= 1.0f));

		clear();

		m_remap_table.resize(num_syms);
		m_entries_picked.reserve(num_syms);
		m_total_count_to_picked.resize(num_syms);

		if (num_indices <= 1)
			return;

		prepare_hist(num_syms, num_indices, pIndices);
		find_initial(num_syms);

		while (m_entries_to_do.size())
		{
			// Find the best entry to move into the picked list.
			uint32_t best_entry;
			double best_count;
			find_next_entry(best_entry, best_count, pDist_func, pCtx, dist_func_weight);

			// We now have chosen an entry to place in the picked list, now determine which side it goes on.
			const uint32_t entry_to_move = m_entries_to_do[best_entry];
								
			float side = pick_side(num_syms, entry_to_move, pDist_func, pCtx, dist_func_weight);
								
			// Put entry_to_move either on the "left" or "right" side of the picked entries
			if (side <= 0)
				m_entries_picked.push_back(entry_to_move);
			else
				m_entries_picked.insert(m_entries_picked.begin(), entry_to_move);

			// Erase best_entry from the todo list
			m_entries_to_do.erase(m_entries_to_do.begin() + best_entry);

			// We've just moved best_entry to the picked list, so now we need to update m_total_count_to_picked[] to factor the additional count to best_entry
			for (uint32_t i = 0; i < m_entries_to_do.size(); i++)
				m_total_count_to_picked[m_entries_to_do[i]] += get_hist(m_entries_to_do[i], entry_to_move, num_syms);
		}

		for (uint32_t i = 0; i < num_syms; i++)
			m_remap_table[m_entries_picked[i]] = i;
	}